

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

char * Curl_formpostheader(void *formp,size_t *len)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  puVar1 = *formp;
  if (puVar1 != (undefined8 *)0x0) {
    pcVar2 = (char *)puVar1[2];
    *len = puVar1[3];
    *(undefined8 *)formp = *puVar1;
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *Curl_formpostheader(void *formp, size_t *len)
{
  char *header;
  struct Form *form=(struct Form *)formp;

  if(!form->data)
    return NULL; /* nothing, ERROR! */

  header = form->data->line;
  *len = form->data->length;

  form->data = form->data->next; /* advance */

  return header;
}